

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_test.c
# Opt level: O1

void ecatcheck(void *ptr)

{
  short sVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  char *local_38;
  
  local_38 = &DAT_00107345;
  do {
    if ((inOP != '\0') &&
       ((wkc < expectedWKC || ((&DAT_0010711a)[(ulong)currentgroup * 0x138] != '\0')))) {
      if (needlf != '\0') {
        needlf = '\0';
        putchar(10);
      }
      (&DAT_0010711a)[(ulong)currentgroup * 0x138] = 0;
      ec_readstate();
      if (0 < _ec_slavecount) {
        uVar3 = 1;
        lVar6 = 0;
        pcVar5 = local_38;
        do {
          if (pcVar5[-2] == currentgroup) {
            sVar1 = *(short *)(pcVar5 + -0x10d);
            if (sVar1 != 8) {
              (&DAT_0010711a)[(ulong)currentgroup * 0x138] = 1;
              if (sVar1 == 0) {
                if (*pcVar5 == '\0') {
                  ec_statecheck(uVar3 & 0xffff,8,2000);
                  if (*(short *)(pcVar5 + -0x10d) == 0) {
                    *pcVar5 = '\x01';
                    pcVar4 = "ERROR : slave %d lost\n";
LAB_00102a98:
                    printf(pcVar4,uVar3);
                  }
                }
              }
              else {
                if (sVar1 == 4) {
                  printf("WARNING : slave %d is in SAFE_OP, change to OPERATIONAL.\n",uVar3);
                  pcVar5[-0x10d] = '\b';
                  pcVar5[-0x10c] = '\0';
                }
                else {
                  if (sVar1 != 0x14) {
                    iVar2 = ec_reconfig_slave(uVar3 & 0xffff,500);
                    if (iVar2 != 0) {
                      *pcVar5 = '\0';
                      pcVar4 = "MESSAGE : slave %d reconfigured\n";
                      goto LAB_00102a98;
                    }
                    goto LAB_00102aa1;
                  }
                  printf("ERROR : slave %d is in SAFE_OP + ERROR, attempting ack.\n",uVar3);
                  pcVar5[-0x10d] = '\x14';
                  pcVar5[-0x10c] = '\0';
                }
                ec_writestate(uVar3 & 0xffff);
              }
            }
          }
LAB_00102aa1:
          if (*pcVar5 != '\0') {
            pcVar4 = "MESSAGE : slave %d found\n";
            if (*(short *)(pcVar5 + -0x10d) == 0) {
              iVar2 = ec_recover_slave(uVar3 & 0xffff,500);
              pcVar4 = "MESSAGE : slave %d recovered\n";
              if (iVar2 == 0) goto LAB_00102add;
            }
            *pcVar5 = '\0';
            printf(pcVar4,uVar3);
          }
LAB_00102add:
          uVar3 = (ulong)((int)uVar3 + 1);
          lVar6 = lVar6 + 1;
          pcVar5 = pcVar5 + 0x148;
        } while (lVar6 < _ec_slavecount);
      }
      if ((&DAT_0010711a)[(ulong)currentgroup * 0x138] == '\0') {
        puts("OK : all slaves resumed OPERATIONAL.");
      }
    }
    osal_usleep(10000);
  } while( true );
}

Assistant:

void ecatcheck( void *ptr )
{
    int slave;

    while(1)
    {
        if( inOP && ((wkc < expectedWKC) || ec_group[currentgroup].docheckstate))
        {
            if (needlf)
            {
               needlf = FALSE;
               printf("\n");
            }
            /* one ore more slaves are not responding */
            ec_group[currentgroup].docheckstate = FALSE;
            ec_readstate();
            for (slave = 1; slave <= ec_slavecount; slave++)
            {
               if ((ec_slave[slave].group == currentgroup) && (ec_slave[slave].state != EC_STATE_OPERATIONAL))
               {
                  ec_group[currentgroup].docheckstate = TRUE;
                  if (ec_slave[slave].state == (EC_STATE_SAFE_OP + EC_STATE_ERROR))
                  {
                     printf("ERROR : slave %d is in SAFE_OP + ERROR, attempting ack.\n", slave);
                     ec_slave[slave].state = (EC_STATE_SAFE_OP + EC_STATE_ACK);
                     ec_writestate(slave);
                  }
                  else if(ec_slave[slave].state == EC_STATE_SAFE_OP)
                  {
                     printf("WARNING : slave %d is in SAFE_OP, change to OPERATIONAL.\n", slave);
                     ec_slave[slave].state = EC_STATE_OPERATIONAL;
                     ec_writestate(slave);                              
                  }
                  else if(ec_slave[slave].state > 0)
                  {
                     if (ec_reconfig_slave(slave, EC_TIMEOUTMON))
                     {
                        ec_slave[slave].islost = FALSE;
                        printf("MESSAGE : slave %d reconfigured\n",slave);                           
                     }
                  } 
                  else if(!ec_slave[slave].islost)
                  {
                     /* re-check state */
                     ec_statecheck(slave, EC_STATE_OPERATIONAL, EC_TIMEOUTRET);
                     if (!ec_slave[slave].state)
                     {
                        ec_slave[slave].islost = TRUE;
                        printf("ERROR : slave %d lost\n",slave);                           
                     }
                  }
               }
               if (ec_slave[slave].islost)
               {
                  if(!ec_slave[slave].state)
                  {
                     if (ec_recover_slave(slave, EC_TIMEOUTMON))
                     {
                        ec_slave[slave].islost = FALSE;
                        printf("MESSAGE : slave %d recovered\n",slave);                           
                     }
                  }
                  else
                  {
                     ec_slave[slave].islost = FALSE;
                     printf("MESSAGE : slave %d found\n",slave);                           
                  }
               }
            }
            if(!ec_group[currentgroup].docheckstate)
               printf("OK : all slaves resumed OPERATIONAL.\n");
        }
        osal_usleep(10000);
    }   
}